

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::BeforeDrawValidator::BeforeDrawValidator
          (BeforeDrawValidator *this,Functions *gl,GLuint target,TargetType targetType)

{
  (this->super_DrawUtilCallback)._vptr_DrawUtilCallback = (_func_int **)&PTR_beforeDrawCall_021c1998
  ;
  this->m_gl = gl;
  this->m_target = target;
  this->m_targetType = targetType;
  this->m_validateStatus = -1;
  (this->m_logMessage)._M_dataplus._M_p = (pointer)&(this->m_logMessage).field_2;
  (this->m_logMessage)._M_string_length = 0;
  (this->m_logMessage).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BeforeDrawValidator::BeforeDrawValidator (const glw::Functions& gl, glw::GLuint target, TargetType targetType)
	: m_gl				(gl)
	, m_target			(target)
	, m_targetType		(targetType)
	, m_validateStatus	(-1)
{
	DE_ASSERT(targetType < TARGETTYPE_LAST);
}